

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void ultradiffusion_tick(CHAR_DATA *ch,AFFECT_DATA *af)

{
  uint uVar1;
  
  uVar1 = *(int *)&af->duration - 1;
  if (((ushort)uVar1 < 0x14) && ((0xaaaafU >> (uVar1 & 0x1f) & 1) != 0)) {
    send_to_char(&DAT_00406314 + *(int *)(&DAT_00406314 + (ulong)(uVar1 & 0xffff) * 4),ch);
    return;
  }
  return;
}

Assistant:

void ultradiffusion_tick(CHAR_DATA *ch, AFFECT_DATA *af)
{
	switch (af->duration)
	{
		case 20:
		case 18:
		case 16:
			send_to_char("You note the odd sensation of a few of your component particles drifting away.\n\r", ch);
			break;
		case 14:
		case 12:
		case 10:
			send_to_char("You are starting to lose control of your molecular cohesion.\n\r", ch);
			break;
		case 8:
		case 6:
		case 4:
			send_to_char("You sense that you are coming dangerously close to losing cohesion entirely.\n\r", ch);
			break;
		case 3:
		case 2:
		case 1:
			send_to_char("Your consciousness begins to fade as you lose cohesion.\n\rIt may already be too late.\n\r", ch);
			break;
		default:
			break;
	}
}